

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

void __thiscall
kj::_::Debug::Context::logMessage
          (Context *this,LogSeverity severity,char *file,int line,int contextDepth,String *text)

{
  ExceptionCallback *pEVar1;
  undefined4 in_register_0000000c;
  ulong uVar2;
  undefined4 in_register_00000084;
  char *params_2;
  Value v;
  undefined1 local_89 [25];
  Array<char> local_70;
  Value local_58;
  
  params_2 = (char *)CONCAT44(in_register_00000084,contextDepth);
  uVar2 = CONCAT44(in_register_0000000c,line);
  if (this->logged == false) {
    local_89._1_4_ = line;
    local_89._9_8_ = text;
    ensureInitialized(&local_58,this);
    pEVar1 = (this->super_ExceptionCallback).next;
    local_89._17_8_ = local_58.file;
    local_89._5_4_ = local_58.line;
    local_89[0] = 10;
    str<char_const(&)[10],kj::String,char>
              ((String *)&local_70,(kj *)0x2ae90b,(char (*) [10])&local_58.description,
               (String *)local_89,params_2);
    (*pEVar1->_vptr_ExceptionCallback[4])
              (pEVar1,0,local_89._17_8_,(ulong)(uint)local_89._5_4_,0,&local_70);
    Array<char>::~Array(&local_70);
    this->logged = true;
    Array<char>::~Array(&local_58.description.content);
    uVar2 = (ulong)(uint)local_89._1_4_;
    text = (String *)local_89._9_8_;
  }
  pEVar1 = (this->super_ExceptionCallback).next;
  (*pEVar1->_vptr_ExceptionCallback[4])
            (pEVar1,(ulong)severity,file,uVar2,(ulong)(contextDepth + 1),text);
  return;
}

Assistant:

void Debug::Context::logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                                String&& text) {
  if (!logged) {
    Value v = ensureInitialized();
    next.logMessage(LogSeverity::INFO, v.file, v.line, 0,
                    str("context: ", mv(v.description), '\n'));
    logged = true;
  }

  next.logMessage(severity, file, line, contextDepth + 1, mv(text));
}